

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::syntactic::Medium::~Medium(Medium *this)

{
  long in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x30));
  ParamSet::~ParamSet((ParamSet *)0x1d24b6);
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE Medium : public ParamSet {
      /*! a "Type::SP" shorthand for std::shared_ptr<Type> - makes code
        more concise, and easier to read */
      typedef std::shared_ptr<Medium> SP;
    
      Medium(const std::string &type) : type(type) {};

      /*! pretty-print this medium (for debugging) */
      std::string toString() const;

      /*! the 'type' of the medium */
      std::string type;
    }